

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

string * __thiscall
flatbuffers::BaseGenerator::WrapInNameSpace
          (string *__return_storage_ptr__,BaseGenerator *this,Namespace *ns,string *name)

{
  bool bVar1;
  reference __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator it;
  string qualified_name;
  string *name_local;
  Namespace *ns_local;
  BaseGenerator *this_local;
  
  std::__cxx11::string::string((string *)&it,(string *)(this + 0x20));
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&ns->components);
  while( true ) {
    local_58._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&ns->components);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    __lhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_50);
    std::operator+(&local_78,__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this + 0x40));
    std::__cxx11::string::operator+=((string *)&it,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_50);
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,name);
  std::__cxx11::string::~string((string *)&it);
  return __return_storage_ptr__;
}

Assistant:

std::string BaseGenerator::WrapInNameSpace(const Namespace *ns,
                                           const std::string &name) const {
  std::string qualified_name = qualifying_start_;
  for (auto it = ns->components.begin(); it != ns->components.end(); ++it)
    qualified_name += *it + qualifying_separator_;
  return qualified_name + name;
}